

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_print_longpath.c
# Opt level: O1

void test_print_longpath(void)

{
  wchar_t wVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char buff [2048];
  char local_838 [2047];
  undefined1 local_39;
  
  extract_reference_file("test_print_longpath.tar.Z");
  memset(local_838,0,0x800);
  iVar3 = 1;
  do {
    iVar5 = 0;
    do {
      iVar4 = 10;
      do {
        sVar2 = strlen(local_838);
        strncat(local_838,"0123456789",0x7ff - sVar2);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      sVar2 = strlen(local_838);
      strncat(local_838,"/",0x7ff - sVar2);
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar3);
    sVar2 = strlen(local_838);
    strncat(local_838,"\n",0x7ff - sVar2);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 5);
  local_39 = 0;
  wVar1 = systemf("%s -tf %s >test.out 2>test.err",testprog,"test_print_longpath.tar.Z");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_print_longpath.c"
                      ,L'3',0,"0",(long)wVar1,
                      "systemf(\"%s -tf %s >test.out 2>test.err\", testprog, reffile)",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_print_longpath.c"
             ,L'4',local_838,"test.out");
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_print_longpath.c"
             ,L'5',"test.err");
  return;
}

Assistant:

DEFINE_TEST(test_print_longpath)
{
	const char *reffile = "test_print_longpath.tar.Z";
	char buff[2048];
	int i, j, k;

	/* Reference file has one entry "file" with a very old timestamp. */
	extract_reference_file(reffile);

	/* Build long path pattern. */
	memset(buff, 0, sizeof(buff));
	for (k = 0; k < 4; k++) {
		for (j = 0; j < k+1; j++) {
			for (i = 0; i < 10; i++)
				strncat(buff, "0123456789",
				    sizeof(buff) - strlen(buff) -1);
			strncat(buff, "/", sizeof(buff) - strlen(buff) -1);
		}
		strncat(buff, "\n", sizeof(buff) - strlen(buff) -1);
	}
	buff[sizeof(buff)-1] = '\0';

	assertEqualInt(0,
	    systemf("%s -tf %s >test.out 2>test.err", testprog, reffile));
	assertTextFileContents(buff, "test.out");
	assertEmptyFile("test.err");
}